

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O0

ostream * PyreNet::operator<<(ostream *os,Perceptron *p)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pdVar4;
  double w;
  const_iterator __end1;
  const_iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  Perceptron *p_local;
  ostream *os_local;
  
  poVar2 = (ostream *)std::ostream::operator<<(os,p->inputSize);
  std::operator<<(poVar2," ");
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&p->weights);
  poVar2 = (ostream *)std::ostream::operator<<(os,sVar3);
  std::operator<<(poVar2," ");
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&p->weights);
  w = (double)std::vector<double,_std::allocator<double>_>::end(&p->weights);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&w);
    if (!bVar1) break;
    pdVar4 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    poVar2 = (ostream *)std::ostream::operator<<(os,*pdVar4);
    std::operator<<(poVar2," ");
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Perceptron &p) {
        os << p.inputSize << " ";
        os << p.weights.size() << " ";
        for (double w : p.weights)
            os << w << " ";
        return os;
    }